

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O3

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
::~ArrayMap(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
            *this)

{
  ~ArrayMap(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~ArrayMap() {
    if (attached()) {
      clear();
      detach();
    }
  }